

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# camera.h
# Opt level: O2

ray * __thiscall camera::get_ray(ray *__return_storage_ptr__,camera *this,double s,double t)

{
  double dVar1;
  double dVar2;
  double dVar3;
  double dVar4;
  double dVar5;
  double dVar6;
  undefined1 auVar7 [16];
  double dVar8;
  double dVar9;
  double dVar10;
  double dVar11;
  double dVar12;
  double dVar13;
  double dVar14;
  double dVar15;
  double dVar16;
  double dVar17;
  double dVar18;
  double dVar19;
  double dVar20;
  double dStack_50;
  double local_30;
  double local_28;
  
  dVar20 = this->lens_radius;
  random_in_unit_disk();
  dVar15 = local_30 * dVar20;
  dVar20 = dVar20 * local_28;
  dVar17 = (this->v).e[2] * dVar20 + (this->u).e[2] * dVar15;
  dVar1 = (this->horizontal).e[2];
  dVar2 = (this->lower_left_corner).e[2];
  dVar3 = (this->origin).e[2];
  dVar4 = (this->vertical).e[2];
  dVar5 = this->time0;
  dVar6 = this->time1;
  dVar18 = dVar20 * (this->v).e[0] + dVar15 * (this->u).e[0];
  dVar19 = dVar20 * (this->v).e[1] + dVar15 * (this->u).e[1];
  dVar8 = (this->origin).e[0];
  dVar9 = (this->origin).e[1];
  dVar20 = dVar18 + dVar8;
  dVar15 = dVar19 + dVar9;
  auVar7._8_4_ = SUB84(dVar15,0);
  auVar7._0_8_ = dVar20;
  auVar7._12_4_ = (int)((ulong)dVar15 >> 0x20);
  dVar15 = (this->horizontal).e[0];
  dVar10 = (this->horizontal).e[1];
  dVar11 = (this->lower_left_corner).e[0];
  dVar12 = (this->lower_left_corner).e[1];
  dVar13 = (this->vertical).e[0];
  dVar14 = (this->vertical).e[1];
  dVar16 = random_double();
  dStack_50 = auVar7._8_8_;
  (__return_storage_ptr__->orig).e[0] = dVar20;
  (__return_storage_ptr__->orig).e[1] = dStack_50;
  (__return_storage_ptr__->orig).e[2] = dVar17 + dVar3;
  (__return_storage_ptr__->dir).e[0] = ((t * dVar13 + dVar11 + s * dVar15) - dVar8) - dVar18;
  (__return_storage_ptr__->dir).e[1] = ((t * dVar14 + dVar12 + s * dVar10) - dVar9) - dVar19;
  (__return_storage_ptr__->dir).e[2] = ((dVar4 * t + dVar1 * s + dVar2) - dVar3) - dVar17;
  __return_storage_ptr__->tm = dVar16 * (dVar6 - dVar5) + dVar5;
  return __return_storage_ptr__;
}

Assistant:

ray get_ray(double s, double t) {
        vec3 rd = lens_radius * random_in_unit_disk();
        vec3 offset = u * rd.x() + v * rd.y();

        return ray(
                origin + offset,
                lower_left_corner + s * horizontal + t * vertical - origin - offset,
                random_double(time0, time1)
                );
    }